

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

float Lf_CutArea(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  Jf_Par_t *pJVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  
  uVar2 = *(uint *)&pCut->field_0x14;
  fVar4 = 0.0;
  if ((uVar2 >> 0x17 & 1) == 0 && 0x1ffffff < uVar2) {
    uVar2 = uVar2 >> 0x18;
    pJVar1 = p->pPars;
    if (pJVar1->fPower != 0) {
      fVar4 = Lf_CutSwitches(p,pCut);
      return fVar4 + (float)uVar2;
    }
    if (pJVar1->fOptEdge == 0) {
      if (pJVar1->fCutGroup == 0) {
        return 1.0;
      }
      iVar3 = (pJVar1->nLutSize / 2 < (int)uVar2) + 1;
    }
    else {
      if (pJVar1->fCutGroup == 0) {
        iVar3 = 1;
      }
      else {
        iVar3 = (pJVar1->nLutSize / 2 < (int)uVar2) + 1;
      }
      iVar3 = iVar3 * (pJVar1->nAreaTuner + uVar2);
    }
    fVar4 = (float)iVar3;
  }
  return fVar4;
}

Assistant:

static inline float Lf_CutArea( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    if ( pCut->nLeaves < 2 || pCut->fMux7 )
        return 0;
    if ( p->pPars->fPower )
        return 1.0 * pCut->nLeaves + Lf_CutSwitches( p, pCut );
    if ( p->pPars->fOptEdge )
        return (pCut->nLeaves + p->pPars->nAreaTuner) * (1 + (p->pPars->fCutGroup && (int)pCut->nLeaves > p->pPars->nLutSize/2));
    return 1 + (p->pPars->fCutGroup && (int)pCut->nLeaves > p->pPars->nLutSize/2);
}